

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_filter_intra_predictor_c
               (uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,int mode)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  long lVar12;
  long lVar13;
  size_t __n;
  int iVar14;
  uint8_t buffer [33] [33];
  byte abStack_479 [34];
  uint8_t auStack_457 [1063];
  
  uVar11 = (ulong)(uint)((int)CONCAT71(in_register_00000011,tx_size) << 2);
  __n = (size_t)*(int *)((long)tx_size_wide + uVar11);
  uVar9 = *(uint *)((long)tx_size_high + uVar11);
  uVar11 = 1;
  if (1 < (int)uVar9) {
    uVar11 = (ulong)uVar9;
  }
  lVar12 = 0;
  do {
    auStack_457[lVar12] = *left;
    left = left + 1;
    lVar12 = lVar12 + 0x21;
  } while (uVar11 * 0x21 != lVar12);
  memcpy(abStack_479 + 1,above + -1,__n + 1);
  lVar12 = (long)mode * 0x40;
  lVar10 = 1;
  do {
    lVar1 = lVar10 + -1;
    lVar13 = 1;
    do {
      bVar2 = abStack_479[lVar13 + lVar1 * 0x21];
      bVar3 = abStack_479[lVar13 + lVar1 * 0x21 + 1];
      bVar4 = abStack_479[lVar13 + lVar1 * 0x21 + 2];
      bVar5 = abStack_479[lVar13 + lVar1 * 0x21 + 3];
      bVar6 = abStack_479[lVar13 + lVar1 * 0x21 + 4];
      bVar7 = abStack_479[lVar13 + lVar10 * 0x21];
      bVar8 = abStack_479[lVar13 + (lVar10 + 1) * 0x21];
      uVar11 = 0;
      do {
        iVar14 = (int)*(char *)(lVar12 + 0x559db5 + uVar11 * 8) * (uint)bVar7 +
                 (int)*(char *)(lVar12 + 0x559db4 + uVar11 * 8) * (uint)bVar6 +
                 (int)*(char *)(lVar12 + 0x559db3 + uVar11 * 8) * (uint)bVar5 +
                 (int)*(char *)(lVar12 + 0x559db2 + uVar11 * 8) * (uint)bVar4 +
                 (int)*(char *)(lVar12 + 0x559db1 + uVar11 * 8) * (uint)bVar3 +
                 (int)av1_filter_intra_taps[mode][uVar11][0] * (uint)bVar2 +
                 (int)*(char *)(lVar12 + 0x559db6 + uVar11 * 8) * (uint)bVar8 + 8;
        if (iVar14 >> 4 < 1) {
          iVar14 = 0;
        }
        iVar14 = iVar14 >> 4;
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        abStack_479
        [(ulong)(((uint)uVar11 & 3) + (int)lVar13) +
         (ulong)(((uint)(uVar11 >> 2) & 0x3fffffff) + (int)lVar10) * 0x21 + 1] = (byte)iVar14;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 8);
      lVar13 = lVar13 + 4;
    } while (lVar13 <= (long)__n);
    lVar10 = lVar10 + 2;
  } while (lVar10 <= (int)uVar9);
  uVar11 = 1;
  if (1 < (int)uVar9) {
    uVar11 = (ulong)uVar9;
  }
  lVar12 = 0;
  do {
    memcpy(dst,auStack_457 + lVar12 + 1,__n);
    dst = dst + stride;
    lVar12 = lVar12 + 0x21;
  } while (uVar11 * 0x21 != lVar12);
  return;
}

Assistant:

void av1_filter_intra_predictor_c(uint8_t *dst, ptrdiff_t stride,
                                  TX_SIZE tx_size, const uint8_t *above,
                                  const uint8_t *left, int mode) {
  int r, c;
  uint8_t buffer[33][33];
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];

  assert(bw <= 32 && bh <= 32);

  for (r = 0; r < bh; ++r) buffer[r + 1][0] = left[r];
  memcpy(buffer[0], &above[-1], (bw + 1) * sizeof(uint8_t));

  for (r = 1; r < bh + 1; r += 2)
    for (c = 1; c < bw + 1; c += 4) {
      const uint8_t p0 = buffer[r - 1][c - 1];
      const uint8_t p1 = buffer[r - 1][c];
      const uint8_t p2 = buffer[r - 1][c + 1];
      const uint8_t p3 = buffer[r - 1][c + 2];
      const uint8_t p4 = buffer[r - 1][c + 3];
      const uint8_t p5 = buffer[r][c - 1];
      const uint8_t p6 = buffer[r + 1][c - 1];
      for (int k = 0; k < 8; ++k) {
        int r_offset = k >> 2;
        int c_offset = k & 0x03;
        int pr = av1_filter_intra_taps[mode][k][0] * p0 +
                 av1_filter_intra_taps[mode][k][1] * p1 +
                 av1_filter_intra_taps[mode][k][2] * p2 +
                 av1_filter_intra_taps[mode][k][3] * p3 +
                 av1_filter_intra_taps[mode][k][4] * p4 +
                 av1_filter_intra_taps[mode][k][5] * p5 +
                 av1_filter_intra_taps[mode][k][6] * p6;
        // Section 7.11.2.3 specifies the right-hand side of the assignment as
        //   Clip1( Round2Signed( pr, INTRA_FILTER_SCALE_BITS ) ).
        // Since Clip1() clips a negative value to 0, it is safe to replace
        // Round2Signed() with Round2().
        buffer[r + r_offset][c + c_offset] =
            clip_pixel(ROUND_POWER_OF_TWO(pr, FILTER_INTRA_SCALE_BITS));
      }
    }

  for (r = 0; r < bh; ++r) {
    memcpy(dst, &buffer[r + 1][1], bw * sizeof(uint8_t));
    dst += stride;
  }
}